

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::CropString(string *s,size_t max_len)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t middle;
  string *n;
  string local_58 [32];
  ulong local_38;
  undefined1 local_19;
  ulong local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  uVar1 = local_18;
  if ((((uVar2 & 1) == 0) && (local_18 != 0)) &&
     (uVar2 = std::__cxx11::string::size(), uVar1 < uVar2)) {
    local_19 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    std::__cxx11::string::reserve((ulong)in_RDI);
    local_38 = local_18 >> 1;
    std::__cxx11::string::assign((string *)in_RDI,(ulong)local_10,0);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_10);
    std::__cxx11::string::operator+=((string *)in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
    if (2 < local_18) {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar3 = 0x2e;
      if (3 < local_18) {
        puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
        *puVar3 = 0x2e;
        if (4 < local_18) {
          puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
          *puVar3 = 0x2e;
        }
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::CropString(const std::string& s, size_t max_len)
{
  if (s.empty() || max_len == 0 || max_len >= s.size()) {
    return s;
  }

  std::string n;
  n.reserve(max_len);

  size_t middle = max_len / 2;

  n.assign(s, 0, middle);
  n += s.substr(s.size() - (max_len - middle));

  if (max_len > 2) {
    n[middle] = '.';
    if (max_len > 3) {
      n[middle - 1] = '.';
      if (max_len > 4) {
        n[middle + 1] = '.';
      }
    }
  }

  return n;
}